

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::VariableExpr::do_evaluate
          (Value *__return_storage_ptr__,VariableExpr *this,shared_ptr<minja::Context> *context)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  Value local_80;
  
  peVar1 = (context->super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  Value::Value(&local_80,&this->name);
  iVar2 = (*peVar1->_vptr_Context[4])(peVar1,&local_80);
  Value::~Value(&local_80);
  if ((char)iVar2 == '\0') {
    Value::Value(__return_storage_ptr__);
  }
  else {
    peVar1 = (context->super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Value::Value(&local_80,&this->name);
    iVar2 = (*peVar1->_vptr_Context[3])(peVar1,&local_80);
    Value::Value(__return_storage_ptr__,(Value *)CONCAT44(extraout_var,iVar2));
    Value::~Value(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!context->contains(name)) {
            return Value();
        }
        return context->at(name);
    }